

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall
Js::JavascriptLibrary::SetDebugObjectDebugModeAccessor
          (JavascriptLibrary *this,FunctionInfo *funcGetter)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  if (funcGetter == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x75d,"(funcGetter)","funcGetter");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    funcGetter = (FunctionInfo *)0x0;
  }
  pJVar4 = CreateNonProfiledFunction(this,funcGetter);
  addr = &(this->super_JavascriptLibraryBase).debugObjectDebugModeGetterFunction;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_JavascriptLibraryBase).debugObjectDebugModeGetterFunction.ptr = pJVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pJVar4 = (this->super_JavascriptLibraryBase).debugObjectDebugModeGetterFunction.ptr;
  (*(pJVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (pJVar4,0xd1,0x1000000000000,2,0,0,CONCAT44(uVar5,0xf));
  return;
}

Assistant:

void JavascriptLibrary::SetDebugObjectDebugModeAccessor(FunctionInfo *funcGetter)
    {
        Assert(funcGetter);

        debugObjectDebugModeGetterFunction = CreateNonProfiledFunction(funcGetter);
        debugObjectDebugModeGetterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable, nullptr);
    }